

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O2

SRC_STATE * zoh_state_new(int channels,SRC_ERROR *error)

{
  SRC_STATE *state;
  undefined4 *__ptr;
  void *pvVar1;
  SRC_ERROR SVar2;
  
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                  ,0xbc,"SRC_STATE *zoh_state_new(int, SRC_ERROR *)");
  }
  if (error == (SRC_ERROR *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_zoh.c"
                  ,0xbd,"SRC_STATE *zoh_state_new(int, SRC_ERROR *)");
  }
  state = (SRC_STATE *)calloc(1,0x50);
  SVar2 = SRC_ERR_MALLOC_FAILED;
  if (state != (SRC_STATE *)0x0) {
    state->channels = channels;
    __ptr = (undefined4 *)calloc(1,0x30);
    if (__ptr != (undefined4 *)0x0) {
      *__ptr = 0x6f70a93;
      pvVar1 = calloc((ulong)(uint)channels,4);
      *(void **)(__ptr + 10) = pvVar1;
      if (pvVar1 != (void *)0x0) {
        state->private_data = __ptr;
        state->vt = &zoh_state_vt;
        zoh_reset(state);
        SVar2 = SRC_ERR_NO_ERROR;
        goto LAB_00104808;
      }
      free(__ptr);
    }
    free(state);
  }
  state = (SRC_STATE *)0x0;
LAB_00104808:
  *error = SVar2;
  return state;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
zoh_state_new (int channels, SRC_ERROR *error)
{
	assert (channels > 0) ;
	assert (error != NULL) ;

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	state->private_data = zoh_data_new (state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->vt = &zoh_state_vt ;

	zoh_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}